

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmTextureCalc::GetBltInfoPerPlane
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_RES_COPY_BLT *pBlt,uint32_t PlaneId)

{
  uint32_t PlaneId_local;
  GMM_RES_COPY_BLT *pBlt_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  if (PlaneId == 1) {
    (pBlt->Gpu).OffsetX = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[1];
    (pBlt->Gpu).OffsetY = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5];
    (pBlt->Blt).Height = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[9];
  }
  else if (PlaneId == 2) {
    (pBlt->Gpu).OffsetX = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[2];
    (pBlt->Gpu).OffsetY = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[6];
    (pBlt->Sys).pData =
         (void *)((long)(pBlt->Sys).pData + (ulong)((pBlt->Blt).Height * (pBlt->Sys).RowPitch));
    (pBlt->Blt).Height = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[10];
  }
  else {
    (pBlt->Gpu).OffsetX = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[3];
    (pBlt->Gpu).OffsetY = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[7];
    (pBlt->Blt).Height = (uint32_t)(pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[10];
    (pBlt->Sys).pData =
         (void *)((long)(pBlt->Sys).pData + (ulong)((pBlt->Blt).Height * (pBlt->Sys).RowPitch));
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::GetBltInfoPerPlane(GMM_TEXTURE_INFO *pTexInfo, GMM_RES_COPY_BLT *pBlt, uint32_t PlaneId)
{
    if(PlaneId == GMM_PLANE_Y)
    {
        pBlt->Gpu.OffsetX = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_Y]);
        pBlt->Gpu.OffsetY = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y]);
        pBlt->Blt.Height  = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y]);
    }
    else if(PlaneId == GMM_PLANE_U)
    {
        pBlt->Gpu.OffsetX = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_U]);
        pBlt->Gpu.OffsetY = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U]);

        pBlt->Sys.pData  = (char *)pBlt->Sys.pData + uint32_t(pBlt->Blt.Height * pBlt->Sys.RowPitch);
        pBlt->Blt.Height = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U]);
        if(pTexInfo->Flags.Info.RedecribedPlanes)
        {
            __GMM_ASSERT(0);
        }
    }
    else
    {
        pBlt->Gpu.OffsetX = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_V]);
        pBlt->Gpu.OffsetY = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_V]);
        pBlt->Blt.Height  = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U]);
        pBlt->Sys.pData   = (char *)pBlt->Sys.pData + uint32_t(pBlt->Blt.Height * pBlt->Sys.RowPitch);
    }
}